

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QMultiHash<QByteArray,_QByteArray>::iterator::iterator(iterator *this,piter it,Chain **entry)

{
  ulong uVar1;
  Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *pDVar2;
  
  pDVar2 = it.d;
  (this->i).d = pDVar2;
  (this->i).bucket = it.bucket;
  this->e = entry;
  if (entry == (Chain **)0x0 &&
      pDVar2 != (Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)0x0) {
    uVar1 = it.bucket >> 7;
    this->e = (Chain **)
              (pDVar2->spans[uVar1].entries[pDVar2->spans[uVar1].offsets[(uint)it.bucket & 0x7f]].
               storage.data + 0x18);
  }
  return;
}

Assistant:

explicit inline iterator(piter it, Chain **entry = nullptr) noexcept : i(it), e(entry)
        {
            if (!it.atEnd() && !e) {
                e = &it.node()->value;
                Q_ASSERT(e && *e);
            }
        }